

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::detail::Dispatch_Engine::call_member
          (Dispatch_Engine *this,string *t_name,atomic_uint_fast32_t *t_loc,Function_Params *params,
          bool t_has_params,Type_Conversions_State *t_conversions)

{
  Boxed_Value *t_hint;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *pvVar1;
  pointer pBVar2;
  bool bVar3;
  dispatch_error *this_00;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000081;
  Function_Params *t_params;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *l_funs;
  Boxed_Value BVar5;
  string_view t_name_00;
  Function_Params l_params;
  Function_Params l_params_00;
  Type_Conversions_State *in_stack_00000008;
  allocator_type local_101;
  exception_ptr except;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_e8;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> tmp_params;
  chaiscript local_b0 [16];
  anon_class_8_1_8991fb9c do_attribute_call;
  pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  funs;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  functions;
  undefined1 local_68 [8];
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_60 [2];
  
  t_params = (Function_Params *)CONCAT71(in_register_00000081,t_has_params);
  t_hint = params->m_begin;
  t_name_00._M_str = (char *)(t_loc->super___atomic_base<unsigned_long>)._M_i;
  t_name_00._M_len = t_loc[1].super___atomic_base<unsigned_long>._M_i;
  get_function(&funs,(Dispatch_Engine *)t_name,t_name_00,(size_t)t_hint);
  if ((Boxed_Value *)funs.first != t_hint) {
    LOCK();
    params->m_begin = (Boxed_Value *)funs.first;
    UNLOCK();
  }
  do_attribute_call.this = (Dispatch_Engine *)t_name;
  bVar3 = is_attribute_call(funs.second.
                            super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,t_params,SUB81(t_conversions,0),in_stack_00000008);
  if (bVar3) {
    l_params.m_end = t_params->m_begin;
    l_params.m_begin = (Boxed_Value *)0x1;
    call_member::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)this,(int)&do_attribute_call,l_params,
               (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                *)t_params->m_end,
               (Type_Conversions_State *)
               funs.second.
               super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  else {
    except._M_exception_object = (void *)0x0;
    if (((funs.second.
          super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->
        super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        ((funs.second.
          super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->
        super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      tmp_params.
      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)t_name;
      tmp_params.
      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)t_params;
      call_member::anon_class_24_3_e36f5151::operator()
                (&functions,(anon_class_24_3_e36f5151 *)&tmp_params);
      tmp_params.
      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&functions;
      bVar3 = call_member::anon_class_8_1_0d378e3b::operator()
                        ((anon_class_8_1_0d378e3b *)&tmp_params);
      if (functions.
          super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          functions.
          super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (except._M_exception_object != (void *)0x0) {
          std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_68,&except);
          uVar4 = std::rethrow_exception((exception_ptr)local_68);
          std::__exception_ptr::exception_ptr::~exception_ptr(&except);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&funs.second.
                      super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          _Unwind_Resume(uVar4);
        }
        this_00 = (dispatch_error *)__cxa_allocate_exception(0x40);
        std::
        vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
        ::
        vector<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>,void>
                  ((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
                    *)local_60,
                   ((funs.second.
                     super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->
                   super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   ((funs.second.
                     super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->
                   super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&tmp_params);
        chaiscript::exception::dispatch_error::dispatch_error(this_00,t_params,local_60);
        __cxa_throw(this_00,&chaiscript::exception::dispatch_error::typeinfo,
                    chaiscript::exception::dispatch_error::~dispatch_error);
      }
      if (bVar3) {
        Function_Params::to_vector(&tmp_params,t_params);
        pBVar2 = tmp_params.
                 super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        var<std::__cxx11::string_const&>
                  ((chaiscript *)&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t_loc);
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
        _M_insert_rval(&tmp_params,pBVar2 + 1,(value_type *)&local_e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_e8.
                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        l_funs = (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                  *)tmp_params.
                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pvVar1 = (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                  *)tmp_params.
                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        if (tmp_params.
            super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            tmp_params.
            super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          l_funs = (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                    *)0x0;
          pvVar1 = (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                    *)0x0;
        }
        l_params_00.m_end = (Boxed_Value *)pvVar1;
        l_params_00.m_begin = (Boxed_Value *)0x2;
        call_member::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)this,(int)&do_attribute_call,l_params_00,l_funs,
                   (Type_Conversions_State *)&functions);
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                  (&tmp_params);
      }
      else {
        std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                   &tmp_params,
                   (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                   t_params->m_begin);
        var<std::__cxx11::string_const&>
                  ((chaiscript *)
                   &tmp_params.
                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t_loc);
        std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
        vector<chaiscript::Boxed_Value_const*,void>
                  ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)
                   &local_e8,t_params->m_begin + 1,t_params->m_end,&local_101);
        var<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
                  (local_b0,&local_e8);
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                  (&local_e8);
        local_e8.
        super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)&do_attribute_call;
        local_e8.
        super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)&tmp_params;
        dispatch::
        dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                  ((dispatch *)this,&functions,(Function_Params *)&local_e8,in_stack_00000008);
        std::array<chaiscript::Boxed_Value,_3UL>::~array
                  ((array<chaiscript::Boxed_Value,_3UL> *)&tmp_params);
      }
      std::
      vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
      ::~vector(&functions);
    }
    else {
      dispatch::
      dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                ((dispatch *)this,
                 funs.second.
                 super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,t_params,in_stack_00000008);
    }
    std::__exception_ptr::exception_ptr::~exception_ptr(&except);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&funs.second.
              super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value call_member(const std::string &t_name,
                              std::atomic_uint_fast32_t &t_loc,
                              const Function_Params &params,
                              bool t_has_params,
                              const Type_Conversions_State &t_conversions) {
        uint_fast32_t loc = t_loc;
        const auto funs = get_function(t_name, loc);
        if (funs.first != loc) {
          t_loc = uint_fast32_t(funs.first);
        }

        const auto do_attribute_call = [this](int l_num_params,
                                              Function_Params l_params,
                                              const std::vector<Proxy_Function> &l_funs,
                                              const Type_Conversions_State &l_conversions) -> Boxed_Value {
          Function_Params attr_params(l_params.begin(), l_params.begin() + l_num_params);
          Boxed_Value bv = dispatch::dispatch(l_funs, attr_params, l_conversions);
          if (l_num_params < int(l_params.size()) || bv.get_type_info().bare_equal(user_type<dispatch::Proxy_Function_Base>())) {
            struct This_Foist {
              This_Foist(Dispatch_Engine &e, const Boxed_Value &t_bv)
                  : m_e(e) {
                m_e.get().new_scope();
                m_e.get().add_object("__this", t_bv);
              }

              ~This_Foist() { m_e.get().pop_scope(); }

              std::reference_wrapper<Dispatch_Engine> m_e;
            };

            This_Foist fi(*this, l_params.front());

            try {
              auto func = boxed_cast<const dispatch::Proxy_Function_Base *>(bv);
              try {
                return (*func)({l_params.begin() + l_num_params, l_params.end()}, l_conversions);
              } catch (const chaiscript::exception::bad_boxed_cast &) {
              } catch (const chaiscript::exception::arity_error &) {
              } catch (const chaiscript::exception::guard_error &) {
              }
              throw chaiscript::exception::dispatch_error({l_params.begin() + l_num_params, l_params.end()},
                                                          std::vector<Const_Proxy_Function>{boxed_cast<Const_Proxy_Function>(bv)});
            } catch (const chaiscript::exception::bad_boxed_cast &) {
              // unable to convert bv into a Proxy_Function_Base
              throw chaiscript::exception::dispatch_error({l_params.begin() + l_num_params, l_params.end()},
                                                          std::vector<Const_Proxy_Function>(l_funs.begin(), l_funs.end()));
            }
          } else {
            return bv;
          }
        };

        if (is_attribute_call(*funs.second, params, t_has_params, t_conversions)) {
          return do_attribute_call(1, params, *funs.second, t_conversions);
        } else {
          std::exception_ptr except;

          if (!funs.second->empty()) {
            try {
              return dispatch::dispatch(*funs.second, params, t_conversions);
            } catch (chaiscript::exception::dispatch_error &) {
              except = std::current_exception();
            }
          }

          // If we get here we know that either there was no method with that name,
          // or there was no matching method

          const auto functions = [&]() -> std::vector<Proxy_Function> {
            std::vector<Proxy_Function> fs;

            const auto method_missing_funs = get_method_missing_functions();

            for (const auto &f : *method_missing_funs) {
              if (f->compare_first_type(params[0], t_conversions)) {
                fs.push_back(f);
              }
            }

            return fs;
          }();

          const bool is_no_param = [&]() -> bool {
            for (const auto &f : functions) {
              if (f->get_arity() != 2) {
                return false;
              }
            }
            return true;
          }();

          if (!functions.empty()) {
            try {
              if (is_no_param) {
                auto tmp_params = params.to_vector();
                tmp_params.insert(tmp_params.begin() + 1, var(t_name));
                return do_attribute_call(2, Function_Params(tmp_params), functions, t_conversions);
              } else {
                std::array<Boxed_Value, 3> p{params[0], var(t_name), var(std::vector<Boxed_Value>(params.begin() + 1, params.end()))};
                return dispatch::dispatch(functions, Function_Params{p}, t_conversions);
              }
            } catch (const dispatch::option_explicit_set &e) {
              throw chaiscript::exception::dispatch_error(params,
                                                          std::vector<Const_Proxy_Function>(funs.second->begin(), funs.second->end()),
                                                          e.what());
            }
          }

          // If we get all the way down here we know there was no "method_missing"
          // method at all.
          if (except) {
            std::rethrow_exception(except);
          } else {
            throw chaiscript::exception::dispatch_error(params,
                                                        std::vector<Const_Proxy_Function>(funs.second->begin(), funs.second->end()));
          }
        }
      }